

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

uint64_t cpacr_read(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri)

{
  ulong uVar1;
  
  uVar1 = (env->cp15).cpacr_el1;
  if ((env->features & 0x210000000) == 0x200000000) {
    if (env->aarch64 == 0) {
      if ((env->uncached_cpsr & 0x1f) == 0x16) {
        return uVar1;
      }
    }
    else if ((~env->pstate & 0xc) == 0) {
      return uVar1;
    }
    if (((env->cp15).scr_el3 & 1) != 0) {
      if (((env->cp15).nsacr & 0x400) == 0) {
        uVar1 = uVar1 & 0xffffffffff0fffff;
      }
      return uVar1;
    }
  }
  return uVar1;
}

Assistant:

static uint64_t cpacr_read(CPUARMState *env, const ARMCPRegInfo *ri)
{
    /*
     * For A-profile AArch32 EL3 (but not M-profile secure mode), if NSACR.CP10
     * is 0 then CPACR.{CP11,CP10} ignore writes and read as 0b00.
     */
    uint64_t value = env->cp15.cpacr_el1;

    if (arm_feature(env, ARM_FEATURE_EL3) && !arm_el_is_aa64(env, 3) &&
        !arm_is_secure(env) && !extract32(env->cp15.nsacr, 10, 1)) {
        value &= ~(0xf << 20);
    }
    return value;
}